

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_fee.cpp
# Opt level: O0

void __thiscall
FeeCalculator_CalculateFeeTest_Test::TestBody(FeeCalculator_CalculateFeeTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  Amount amt;
  long *in_stack_fffffffffffffec0;
  long *in_stack_fffffffffffffec8;
  AssertionResult *this_00;
  undefined6 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed6;
  undefined1 in_stack_fffffffffffffed7;
  char *in_stack_fffffffffffffed8;
  AssertHelper local_f0;
  Message local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  AssertionResult local_d0;
  AssertHelper local_c0;
  Message local_b8;
  char *local_b0;
  undefined1 local_a8;
  char *local_a0;
  undefined1 local_98;
  AssertHelper local_90;
  Message local_88;
  undefined8 local_80;
  undefined8 local_78;
  AssertionResult local_70;
  AssertHelper local_60;
  Message local_58 [2];
  char *local_48;
  undefined1 local_40;
  char *local_38;
  undefined1 local_30;
  char *local_18;
  undefined1 local_10;
  
  cfd::core::Amount::Amount((Amount *)&local_18);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_48 = (char *)cfd::FeeCalculator::CalculateFee(3000,1000,11000);
      local_40 = extraout_DL;
      local_38 = local_48;
      local_30 = extraout_DL;
      local_18 = local_48;
      local_10 = extraout_DL;
    }
  }
  else {
    testing::Message::Message(local_58);
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_fee.cpp"
               ,0x14,
               "Expected: (amt = FeeCalculator::CalculateFee(3000, 1000, 11000)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_60,local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::Message::~Message((Message *)0x1c0b48);
  }
  local_78 = cfd::core::Amount::GetSatoshiValue();
  local_80 = 11000;
  testing::internal::EqHelper<false>::Compare<long,long>
            (in_stack_fffffffffffffed8,
             (char *)CONCAT17(in_stack_fffffffffffffed7,
                              CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1c0c38);
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_fee.cpp"
               ,0x15,pcVar2);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message((Message *)0x1c0c95);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c0ced);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_fffffffffffffed8 = (char *)cfd::FeeCalculator::CalculateFee(3000,3000,10000);
      in_stack_fffffffffffffed7 = extraout_DL_00;
      local_b0 = in_stack_fffffffffffffed8;
      local_a8 = extraout_DL_00;
      local_a0 = in_stack_fffffffffffffed8;
      local_98 = extraout_DL_00;
      local_18 = in_stack_fffffffffffffed8;
      local_10 = extraout_DL_00;
    }
  }
  else {
    testing::Message::Message(&local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_fee.cpp"
               ,0x17,
               "Expected: (amt = FeeCalculator::CalculateFee(3000, 3000, 10000)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message((Message *)0x1c0e38);
  }
  local_d8 = cfd::core::Amount::GetSatoshiValue();
  local_e0 = 30000;
  this_00 = &local_d0;
  testing::internal::EqHelper<false>::Compare<long,long>
            (in_stack_fffffffffffffed8,
             (char *)CONCAT17(in_stack_fffffffffffffed7,
                              CONCAT16(in_stack_fffffffffffffed6,in_stack_fffffffffffffed0)),
             (long *)this_00,in_stack_fffffffffffffec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (!bVar1) {
    testing::Message::Message(&local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1c0f13);
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_fee.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f0,&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    testing::Message::~Message((Message *)0x1c0f61);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1c0fad);
  return;
}

Assistant:

TEST(FeeCalculator, CalculateFeeTest)
{
  Amount amt;
  EXPECT_NO_THROW((amt = FeeCalculator::CalculateFee(3000, 1000, 11000)));
  EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(11000));

  EXPECT_NO_THROW((amt = FeeCalculator::CalculateFee(3000, 3000, 10000)));
  EXPECT_EQ(amt.GetSatoshiValue(), static_cast<int64_t>(30000));
}